

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

int cdef_find_dir_sse4_1(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar17;
  uint uVar18;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  short sVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  short sVar29;
  short sVar30;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int32_t cost [8];
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  undefined1 local_68 [16];
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  uint local_28 [4];
  uint local_18;
  uint uStack_14;
  uint uStack_10;
  uint uStack_c;
  
  lVar8 = 0;
  auVar14 = pmovsxbw(in_XMM1,0x8080808080808080);
  do {
    auVar19 = lddqu(in_XMM2,*(undefined1 (*) [16])img);
    auVar19 = psraw(auVar19,ZEXT416((uint)coeff_shift));
    in_XMM2._0_2_ = auVar19._0_2_ + auVar14._0_2_;
    in_XMM2._2_2_ = auVar19._2_2_ + auVar14._2_2_;
    in_XMM2._4_2_ = auVar19._4_2_ + auVar14._4_2_;
    in_XMM2._6_2_ = auVar19._6_2_ + auVar14._6_2_;
    in_XMM2._8_2_ = auVar19._8_2_ + auVar14._8_2_;
    in_XMM2._10_2_ = auVar19._10_2_ + auVar14._10_2_;
    in_XMM2._12_2_ = auVar19._12_2_ + auVar14._12_2_;
    in_XMM2._14_2_ = auVar19._14_2_ + auVar14._14_2_;
    *(undefined1 (*) [16])((long)&local_a8 + lVar8) = in_XMM2;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x80);
  auVar28._0_2_ = local_98 + local_a8;
  auVar28._2_2_ = sStack_96 + sStack_a6;
  auVar28._4_2_ = sStack_94 + sStack_a4;
  auVar28._6_2_ = sStack_92 + sStack_a2;
  auVar28._8_2_ = sStack_90 + sStack_a0;
  auVar28._10_2_ = sStack_8e + sStack_9e;
  auVar28._12_2_ = sStack_8c + sStack_9c;
  auVar28._14_2_ = sStack_8a + sStack_9a;
  auVar39._0_2_ = local_78 + local_88;
  auVar39._2_2_ = sStack_76 + sStack_86;
  auVar39._4_2_ = sStack_74 + sStack_84;
  auVar39._6_2_ = sStack_72 + sStack_82;
  auVar39._8_2_ = sStack_70 + sStack_80;
  auVar39._10_2_ = sStack_6e + sStack_7e;
  auVar39._12_2_ = sStack_6c + sStack_7c;
  auVar39._14_2_ = sStack_6a + sStack_7a;
  auVar61._0_2_ = auVar39._0_2_ + auVar28._0_2_;
  auVar61._2_2_ = auVar39._2_2_ + auVar28._2_2_;
  auVar61._4_2_ = auVar39._4_2_ + auVar28._4_2_;
  auVar61._6_2_ = auVar39._6_2_ + auVar28._6_2_;
  auVar61._8_2_ = auVar39._8_2_ + auVar28._8_2_;
  auVar61._10_2_ = auVar39._10_2_ + auVar28._10_2_;
  auVar61._12_2_ = auVar39._12_2_ + auVar28._12_2_;
  auVar61._14_2_ = auVar39._14_2_ + auVar28._14_2_;
  sVar29 = local_68._0_2_;
  auVar41._0_2_ = local_58 + sVar29;
  sVar32 = local_68._2_2_;
  auVar41._2_2_ = sStack_56 + sVar32;
  sVar33 = local_68._4_2_;
  auVar41._4_2_ = sStack_54 + sVar33;
  sVar34 = local_68._6_2_;
  auVar41._6_2_ = sStack_52 + sVar34;
  sVar35 = local_68._8_2_;
  auVar41._8_2_ = sStack_50 + sVar35;
  sVar36 = local_68._10_2_;
  auVar41._10_2_ = sStack_4e + sVar36;
  sVar37 = local_68._12_2_;
  auVar41._12_2_ = sStack_4c + sVar37;
  sVar38 = local_68._14_2_;
  auVar41._14_2_ = sStack_4a + sVar38;
  sVar30 = (short)((ulong)uStack_40 >> 0x30);
  auVar31._0_2_ = sVar30 + sStack_4c + sVar36 + sStack_70 + sStack_82 + sStack_94 + sStack_a6;
  auVar31._2_2_ = sStack_4a + sVar37 + sStack_6e + sStack_80 + sStack_92 + sStack_a4;
  auVar31._4_2_ = sVar38 + sStack_6c + sStack_7e + sStack_90 + sStack_a2;
  auVar31._6_2_ = sStack_6a + sStack_7c + sStack_8e + sStack_a0;
  auVar31._8_2_ = sStack_7a + sStack_8c + sStack_9e;
  auVar31._10_2_ = sStack_8a + sStack_9c;
  auVar31._12_2_ = sStack_9a;
  auVar31._14_2_ = 0;
  sVar53 = (short)local_48;
  sVar54 = (short)((ulong)local_48 >> 0x10);
  sVar55 = (short)((ulong)local_48 >> 0x20);
  sVar27 = sStack_56 + sVar29 + sStack_32 + sVar55;
  sVar56 = (short)((ulong)local_48 >> 0x30);
  sVar57 = (short)uStack_40;
  sVar58 = (short)((ulong)uStack_40 >> 0x10);
  sVar59 = (short)((ulong)uStack_40 >> 0x20);
  auVar51._0_2_ = local_38 + sVar53;
  auVar51._2_2_ = sStack_36 + sVar54;
  auVar51._4_2_ = sStack_34 + sVar55;
  auVar51._6_2_ = sStack_32 + sVar56;
  auVar51._8_2_ = sStack_30 + sVar57;
  auVar51._10_2_ = sStack_2e + sVar58;
  auVar51._12_2_ = sStack_2c + sVar59;
  auVar51._14_2_ = sStack_2a + sVar30;
  auVar47._0_2_ = auVar41._0_2_ + auVar51._0_2_ + auVar61._0_2_;
  auVar47._2_2_ = auVar41._2_2_ + auVar51._2_2_ + auVar61._2_2_;
  auVar47._4_2_ = auVar41._4_2_ + auVar51._4_2_ + auVar61._4_2_;
  auVar47._6_2_ = auVar41._6_2_ + auVar51._6_2_ + auVar61._6_2_;
  auVar47._8_2_ = auVar41._8_2_ + auVar51._8_2_ + auVar61._8_2_;
  auVar47._10_2_ = auVar41._10_2_ + auVar51._10_2_ + auVar61._10_2_;
  auVar47._12_2_ = auVar41._12_2_ + auVar51._12_2_ + auVar61._12_2_;
  auVar47._14_2_ = auVar41._14_2_ + auVar51._14_2_ + auVar61._14_2_;
  auVar14 = pshufb(auVar31,_DAT_005273e0);
  auVar20._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar14._6_2_,sVar27),auVar14._4_2_),
                 CONCAT22(local_58 + sStack_34 + sVar54,sVar27)) >> 0x10);
  auVar20._6_2_ = auVar14._2_2_;
  auVar20._4_2_ = sStack_36 + sVar53;
  auVar20._2_2_ = auVar14._0_2_;
  auVar20._0_2_ = local_38;
  auVar24._2_2_ = auVar14._8_2_;
  auVar24._0_2_ = sStack_54 + sVar32 + sStack_30 + local_78 + sVar56;
  auVar24._4_2_ = sStack_52 + sVar33 + sStack_2e + sStack_76 + local_88 + sVar57;
  auVar24._6_2_ = auVar14._10_2_;
  auVar24._8_2_ = sStack_50 + sVar34 + sStack_2c + sStack_74 + sStack_86 + local_98 + sVar58;
  auVar24._10_2_ = auVar14._12_2_;
  auVar24._12_2_ =
       sStack_4e + sVar35 + sStack_2a + sStack_72 + sStack_84 + sStack_96 + local_a8 + sVar59;
  auVar24._14_2_ = auVar14._14_2_;
  auVar14 = pmaddwd(auVar20,auVar20);
  auVar19 = pmaddwd(auVar24,auVar24);
  auVar15 = pmulld(auVar14,_DAT_005273f0);
  auVar25 = pmulld(auVar19,_DAT_00527400);
  auVar14 = pblendw((undefined1  [16])0x0,auVar28,0xc0);
  auVar19 = pshufhw(auVar14,auVar14,0x6c);
  auVar14 = pblendw((undefined1  [16])0x0,auVar39,0xe0);
  auVar22 = pshufhw(auVar14,auVar14,0x1b);
  auVar16 = pshufb(auVar41,_DAT_00527410);
  auVar23 = pshufb(auVar51,_DAT_00527420);
  uVar2 = CONCAT22(auVar28._0_2_,auVar39._0_2_ + auVar28._2_2_);
  auVar4._2_8_ = (long)(CONCAT64(CONCAT42(CONCAT22(auVar23._6_2_ + auVar16._6_2_ +
                                                   auVar22._6_2_ + auVar19._6_2_,
                                                   auVar39._0_2_ + auVar28._2_2_),
                                          auVar23._4_2_ + auVar16._4_2_ +
                                          auVar22._4_2_ + auVar19._4_2_),uVar2) >> 0x10);
  auVar4._0_2_ = auVar23._2_2_ + auVar16._2_2_ + auVar22._2_2_ + auVar19._2_2_;
  auVar4._10_2_ = 0;
  auVar14._2_12_ = auVar4 << 0x10;
  auVar14._0_2_ = auVar23._0_2_ + auVar16._0_2_ + auVar22._0_2_ + auVar19._0_2_;
  auVar14._14_2_ = 0;
  auVar60._2_2_ = auVar23._8_2_ + auVar16._8_2_ + auVar22._8_2_ + auVar19._8_2_;
  auVar60._0_2_ = auVar41._0_2_ + auVar39._2_2_ + auVar28._4_2_;
  auVar60._4_2_ = auVar51._0_2_ + auVar41._2_2_ + auVar39._4_2_ + auVar28._6_2_;
  auVar60._6_2_ = auVar23._10_2_ + auVar16._10_2_ + auVar22._10_2_ + auVar19._10_2_;
  auVar60._8_2_ = auVar51._2_2_ + auVar41._4_2_ + auVar39._6_2_ + auVar28._8_2_;
  auVar60._10_2_ = auVar23._12_2_ + auVar16._12_2_ + auVar22._12_2_ + auVar19._12_2_;
  auVar60._12_2_ = auVar51._4_2_ + auVar41._6_2_ + auVar39._8_2_ + auVar28._10_2_;
  auVar60._14_2_ = auVar23._14_2_ + auVar16._14_2_ + auVar22._14_2_ + auVar19._14_2_;
  auVar14 = pmaddwd(auVar14 << 0x10,auVar14 << 0x10);
  auVar19 = pmaddwd(auVar60,auVar60);
  auVar23 = pmovsxwd(auVar61,0xd201a400000000);
  auVar16 = pmulld(auVar14,auVar23);
  auVar20 = pmovzxbd(auVar23,0x6969698c);
  auVar61 = pmulld(auVar19,auVar20);
  auVar14 = pshufb(auVar28,_DAT_00527420);
  auVar19 = pshufb(auVar39,_DAT_00527410);
  auVar40._0_2_ = auVar19._0_2_ + auVar14._0_2_;
  auVar40._2_2_ = auVar19._2_2_ + auVar14._2_2_;
  auVar40._4_2_ = auVar19._4_2_ + auVar14._4_2_;
  auVar40._6_2_ = auVar19._6_2_ + auVar14._6_2_;
  auVar40._8_2_ = auVar19._8_2_ + auVar14._8_2_;
  auVar40._10_2_ = auVar19._10_2_ + auVar14._10_2_;
  auVar40._12_2_ = auVar19._12_2_ + auVar14._12_2_;
  auVar40._14_2_ = auVar19._14_2_ + auVar14._14_2_;
  auVar14 = pblendw(auVar41,(undefined1  [16])0x0,0x1f);
  auVar22 = pshufhw(auVar16,auVar14,0x1b);
  auVar14 = pblendw(auVar51,(undefined1  [16])0x0,0x3f);
  auVar14 = pshufhw(auVar14,auVar14,0x6c);
  uVar2 = CONCAT22(auVar51._0_2_,auVar51._2_2_ + auVar41._0_2_);
  auVar5._2_8_ = (long)(CONCAT64(CONCAT42(CONCAT22(auVar14._6_2_ + auVar22._6_2_ + auVar40._6_2_,
                                                   auVar51._2_2_ + auVar41._0_2_),
                                          auVar14._4_2_ + auVar22._4_2_ + auVar40._4_2_),uVar2) >>
                       0x10);
  auVar5._0_2_ = auVar14._2_2_ + auVar22._2_2_ + auVar40._2_2_;
  auVar5._10_2_ = 0;
  auVar19._2_12_ = auVar5 << 0x10;
  auVar19._0_2_ = auVar14._0_2_ + auVar22._0_2_ + auVar40._0_2_;
  auVar19._14_2_ = 0;
  auVar50._2_2_ = auVar14._8_2_ + auVar22._8_2_ + auVar40._8_2_;
  auVar50._0_2_ = auVar51._4_2_ + auVar41._2_2_ + auVar39._0_2_;
  auVar50._4_2_ = auVar51._6_2_ + auVar41._4_2_ + auVar39._2_2_ + auVar28._0_2_;
  auVar50._6_2_ = auVar14._10_2_ + auVar22._10_2_ + auVar40._10_2_;
  auVar50._8_2_ = auVar51._8_2_ + auVar41._6_2_ + auVar39._4_2_ + auVar28._2_2_;
  auVar50._10_2_ = auVar14._12_2_ + auVar22._12_2_ + auVar40._12_2_;
  auVar50._12_2_ = auVar51._10_2_ + auVar41._8_2_ + auVar39._6_2_ + auVar28._4_2_;
  auVar50._14_2_ = auVar14._14_2_ + auVar22._14_2_ + auVar40._14_2_;
  auVar14 = pmaddwd(auVar19 << 0x10,auVar19 << 0x10);
  auVar19 = pmaddwd(auVar50,auVar50);
  auVar14 = pmulld(auVar14,auVar23);
  auVar51 = pmulld(auVar19,auVar20);
  auVar19 = pmaddwd(auVar47,auVar47);
  auVar20 = pmovsxbd(auVar40,0x69696969);
  auVar19 = pmulld(auVar19,auVar20);
  local_18 = auVar25._12_4_ + auVar15._12_4_ + auVar25._8_4_ + auVar15._8_4_ +
             auVar25._4_4_ + auVar15._4_4_ + auVar25._0_4_ + auVar15._0_4_;
  uStack_14 = auVar51._12_4_ + auVar14._12_4_ + auVar51._8_4_ + auVar14._8_4_ +
              auVar51._4_4_ + auVar14._4_4_ + auVar51._0_4_ + auVar14._0_4_;
  uStack_10 = auVar19._12_4_ + auVar19._8_4_ + auVar19._4_4_ + auVar19._0_4_;
  uStack_c = auVar61._12_4_ + auVar16._12_4_ + auVar61._8_4_ + auVar16._8_4_ +
             auVar61._4_4_ + auVar16._4_4_ + auVar61._0_4_ + auVar16._0_4_;
  auVar48._0_2_ = sStack_9a + sStack_9c;
  auVar48._2_2_ = sStack_8a + sStack_8c;
  auVar48._4_2_ = sStack_7a + sStack_7c;
  auVar48._6_2_ = sStack_6a + sStack_6c;
  auVar48._8_2_ = sVar38 + sVar37;
  auVar48._10_2_ = sStack_4a + sStack_4c;
  auVar48._12_2_ = sVar30 + sVar59;
  auVar48._14_2_ = sStack_2a + sStack_2c;
  auVar43._0_2_ = sStack_9e + sStack_a0;
  auVar43._2_2_ = sStack_8e + sStack_90;
  auVar43._4_2_ = sStack_7e + sStack_80;
  auVar43._6_2_ = sStack_6e + sStack_70;
  auVar43._8_2_ = sVar36 + sVar35;
  auVar43._10_2_ = sStack_4e + sStack_50;
  auVar43._12_2_ = sVar58 + sVar57;
  auVar43._14_2_ = sStack_2e + sStack_30;
  auVar21._0_2_ = sStack_a2 + sStack_a4;
  auVar21._2_2_ = sStack_92 + sStack_94;
  auVar21._4_2_ = sStack_82 + sStack_84;
  auVar21._6_2_ = sStack_72 + sStack_74;
  auVar21._8_2_ = sVar34 + sVar33;
  auVar21._10_2_ = sStack_52 + sStack_54;
  auVar21._12_2_ = sVar56 + sVar55;
  auVar21._14_2_ = sStack_32 + sStack_34;
  auVar22._0_2_ = sStack_36 + sVar55 + sStack_52 + sVar35 + sStack_6e + sStack_7c + sStack_8a;
  auVar22._2_2_ = sStack_34 + sVar56 + sStack_50 + sVar36 + sStack_6c + sStack_7a;
  auVar22._4_2_ = sStack_32 + sVar57 + sStack_4e + sVar37 + sStack_6a;
  auVar22._6_2_ = sStack_30 + sVar58 + sStack_4c + sVar38;
  auVar22._8_2_ = sStack_2e + sVar59 + sStack_4a;
  auVar22._10_2_ = sStack_2c + sVar30;
  auVar22._12_2_ = sStack_2a;
  auVar22._14_2_ = 0;
  auVar25._0_2_ = local_a8 + sStack_a6;
  auVar25._2_2_ = local_98 + sStack_96;
  auVar25._4_2_ = local_88 + sStack_86;
  auVar25._6_2_ = local_78 + sStack_76;
  auVar25._8_2_ = sVar29 + sVar32;
  auVar25._10_2_ = local_58 + sStack_56;
  auVar25._12_2_ = sVar53 + sVar54;
  auVar25._14_2_ = local_38 + sStack_36;
  sVar27 = sStack_94 + sStack_a2 + local_78 + sStack_86;
  auVar62._0_2_ = auVar21._0_2_ + auVar25._0_2_ + auVar43._0_2_ + auVar48._0_2_;
  auVar62._2_2_ = auVar21._2_2_ + auVar25._2_2_ + auVar43._2_2_ + auVar48._2_2_;
  auVar62._4_2_ = auVar21._4_2_ + auVar25._4_2_ + auVar43._4_2_ + auVar48._4_2_;
  auVar62._6_2_ = auVar21._6_2_ + auVar25._6_2_ + auVar43._6_2_ + auVar48._6_2_;
  auVar62._8_2_ = auVar21._8_2_ + auVar25._8_2_ + auVar43._8_2_ + auVar48._8_2_;
  auVar62._10_2_ = auVar21._10_2_ + auVar25._10_2_ + auVar43._10_2_ + auVar48._10_2_;
  auVar62._12_2_ = auVar21._12_2_ + auVar25._12_2_ + auVar43._12_2_ + auVar48._12_2_;
  auVar62._14_2_ = auVar21._14_2_ + auVar25._14_2_ + auVar43._14_2_ + auVar48._14_2_;
  auVar14 = pshufb(auVar22,_DAT_005273e0);
  auVar46._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(auVar14._6_2_,sVar27),auVar14._4_2_),
                 CONCAT22(sStack_a4 + local_88 + sStack_96,sVar27)) >> 0x10);
  auVar46._6_2_ = auVar14._2_2_;
  auVar46._4_2_ = local_98 + sStack_a6;
  auVar46._2_2_ = auVar14._0_2_;
  auVar46._0_2_ = local_a8;
  auVar45._2_2_ = auVar14._8_2_;
  auVar45._0_2_ = sStack_84 + sStack_92 + sVar29 + sStack_a0 + sStack_76;
  auVar45._4_2_ = sStack_74 + sStack_82 + local_58 + sStack_90 + sStack_9e + sVar32;
  auVar45._6_2_ = auVar14._10_2_;
  auVar45._8_2_ = sVar33 + sStack_72 + sVar53 + sStack_80 + sStack_8e + sStack_9c + sStack_56;
  auVar45._10_2_ = auVar14._12_2_;
  auVar45._12_2_ =
       sStack_54 + sVar34 + local_38 + sStack_70 + sStack_7e + sStack_8c + sStack_9a + sVar54;
  auVar45._14_2_ = auVar14._14_2_;
  auVar14 = pmaddwd(auVar46,auVar46);
  auVar22 = pmulld(auVar14,_DAT_005273f0);
  auVar14 = pmaddwd(auVar45,auVar45);
  auVar46 = pmulld(auVar14,_DAT_00527400);
  auVar14 = pblendw((undefined1  [16])0x0,auVar48,0xc0);
  auVar14 = pshufhw(auVar14,auVar14,0x6c);
  auVar19 = pblendw((undefined1  [16])0x0,auVar43,0xe0);
  auVar19 = pshufhw(auVar19,auVar19,0x1b);
  auVar49._0_2_ = auVar19._0_2_ + auVar14._0_2_;
  auVar49._2_2_ = auVar19._2_2_ + auVar14._2_2_;
  auVar49._4_2_ = auVar19._4_2_ + auVar14._4_2_;
  auVar49._6_2_ = auVar19._6_2_ + auVar14._6_2_;
  auVar49._8_2_ = auVar19._8_2_ + auVar14._8_2_;
  auVar49._10_2_ = auVar19._10_2_ + auVar14._10_2_;
  auVar49._12_2_ = auVar19._12_2_ + auVar14._12_2_;
  auVar49._14_2_ = auVar19._14_2_ + auVar14._14_2_;
  auVar14 = pshufb(auVar21,_DAT_00527410);
  auVar19 = pshufb(auVar25,_DAT_00527420);
  auVar42._0_2_ = auVar19._0_2_ + auVar14._0_2_ + auVar49._0_2_;
  auVar42._2_2_ = auVar19._2_2_ + auVar14._2_2_ + auVar49._2_2_;
  auVar42._4_2_ = auVar19._4_2_ + auVar14._4_2_ + auVar49._4_2_;
  auVar42._6_2_ = auVar19._6_2_ + auVar14._6_2_ + auVar49._6_2_;
  auVar42._8_2_ = auVar19._8_2_ + auVar14._8_2_ + auVar49._8_2_;
  auVar42._10_2_ = auVar19._10_2_ + auVar14._10_2_ + auVar49._10_2_;
  auVar42._12_2_ = auVar19._12_2_ + auVar14._12_2_ + auVar49._12_2_;
  auVar42._14_2_ = auVar19._14_2_ + auVar14._14_2_ + auVar49._14_2_;
  uVar3 = CONCAT22(auVar42._6_2_,auVar43._0_2_ + auVar48._2_2_);
  uVar2 = CONCAT22(auVar48._0_2_,auVar43._0_2_ + auVar48._2_2_);
  auVar6._2_8_ = (long)(CONCAT64(CONCAT42(uVar3,auVar42._4_2_),uVar2) >> 0x10);
  auVar6._0_2_ = auVar42._2_2_;
  auVar6._10_2_ = 0;
  auVar15._2_12_ = auVar6 << 0x10;
  auVar15._0_2_ = auVar42._0_2_;
  auVar15._14_2_ = 0;
  auVar44._2_2_ = auVar42._8_2_;
  auVar44._0_2_ = auVar21._0_2_ + auVar43._2_2_ + auVar48._4_2_;
  auVar44._4_2_ = auVar25._0_2_ + auVar21._2_2_ + auVar43._4_2_ + auVar48._6_2_;
  auVar44._6_2_ = auVar42._10_2_;
  auVar44._8_2_ = auVar25._2_2_ + auVar21._4_2_ + auVar43._6_2_ + auVar48._8_2_;
  auVar44._10_2_ = auVar42._12_2_;
  auVar44._12_2_ = auVar25._4_2_ + auVar21._6_2_ + auVar43._8_2_ + auVar48._10_2_;
  auVar44._14_2_ = auVar42._14_2_;
  auVar14 = pmaddwd(auVar15 << 0x10,auVar15 << 0x10);
  auVar19 = pmaddwd(auVar44,auVar44);
  auVar23 = pmovsxwd(auVar49,0xd201a400000000);
  auVar14 = pmulld(auVar14,auVar23);
  auVar61 = pmovzxbd(auVar42,0x6969698c);
  auVar51 = pmulld(auVar19,auVar61);
  auVar49 = pshufb(auVar48,_DAT_00527420);
  auVar44 = pshufb(auVar43,_DAT_00527410);
  auVar19 = pblendw(auVar21,(undefined1  [16])0x0,0x1f);
  auVar19 = pshufhw(auVar14,auVar19,0x1b);
  auVar15 = pblendw(auVar25,(undefined1  [16])0x0,0x3f);
  auVar15 = pshufhw(auVar15,auVar15,0x6c);
  uVar2 = CONCAT22(auVar25._0_2_,auVar25._2_2_ + auVar21._0_2_);
  auVar7._2_8_ = (long)(CONCAT64(CONCAT42(CONCAT22(auVar15._6_2_ +
                                                   auVar19._6_2_ + auVar44._6_2_ + auVar49._6_2_,
                                                   auVar25._2_2_ + auVar21._0_2_),
                                          auVar15._4_2_ +
                                          auVar19._4_2_ + auVar44._4_2_ + auVar49._4_2_),uVar2) >>
                       0x10);
  auVar7._0_2_ = auVar15._2_2_ + auVar19._2_2_ + auVar44._2_2_ + auVar49._2_2_;
  auVar7._10_2_ = 0;
  auVar16._2_12_ = auVar7 << 0x10;
  auVar16._0_2_ = auVar15._0_2_ + auVar19._0_2_ + auVar44._0_2_ + auVar49._0_2_;
  auVar16._14_2_ = 0;
  auVar52._2_2_ = auVar15._8_2_ + auVar19._8_2_ + auVar44._8_2_ + auVar49._8_2_;
  auVar52._0_2_ = auVar25._4_2_ + auVar21._2_2_ + auVar43._0_2_;
  auVar52._4_2_ = auVar25._6_2_ + auVar21._4_2_ + auVar43._2_2_ + auVar48._0_2_;
  auVar52._6_2_ = auVar15._10_2_ + auVar19._10_2_ + auVar44._10_2_ + auVar49._10_2_;
  auVar52._8_2_ = auVar25._8_2_ + auVar21._6_2_ + auVar43._4_2_ + auVar48._2_2_;
  auVar52._10_2_ = auVar15._12_2_ + auVar19._12_2_ + auVar44._12_2_ + auVar49._12_2_;
  auVar52._12_2_ = auVar25._10_2_ + auVar21._8_2_ + auVar43._6_2_ + auVar48._4_2_;
  auVar52._14_2_ = auVar15._14_2_ + auVar19._14_2_ + auVar44._14_2_ + auVar49._14_2_;
  auVar19 = pmaddwd(auVar16 << 0x10,auVar16 << 0x10);
  auVar19 = pmulld(auVar19,auVar23);
  auVar15 = pmaddwd(auVar52,auVar52);
  auVar15 = pmulld(auVar15,auVar61);
  auVar16 = pmaddwd(auVar62,auVar62);
  auVar16 = pmulld(auVar16,auVar20);
  local_28[0] = auVar46._12_4_ + auVar22._12_4_ + auVar46._8_4_ + auVar22._8_4_ +
                auVar46._4_4_ + auVar22._4_4_ + auVar46._0_4_ + auVar22._0_4_;
  local_28[1] = auVar15._12_4_ + auVar19._12_4_ + auVar15._8_4_ + auVar19._8_4_ +
                auVar15._4_4_ + auVar19._4_4_ + auVar15._0_4_ + auVar19._0_4_;
  local_28[2] = auVar16._12_4_ + auVar16._8_4_ + auVar16._4_4_ + auVar16._0_4_;
  local_28[3] = auVar51._12_4_ + auVar14._12_4_ + auVar51._8_4_ + auVar14._8_4_ +
                auVar51._4_4_ + auVar14._4_4_ + auVar51._0_4_ + auVar14._0_4_;
  uVar9 = ((int)local_28[0] < (int)local_18) * local_18 |
          ((int)local_28[0] >= (int)local_18) * local_28[0];
  uVar10 = ((int)local_28[1] < (int)uStack_14) * uStack_14 |
           ((int)local_28[1] >= (int)uStack_14) * local_28[1];
  uVar11 = ((int)local_28[2] < (int)uStack_10) * uStack_10 |
           ((int)local_28[2] >= (int)uStack_10) * local_28[2];
  uVar12 = ((int)local_28[3] < (int)uStack_c) * uStack_c |
           ((int)local_28[3] >= (int)uStack_c) * local_28[3];
  uVar13 = ((int)uVar11 < (int)uVar9) * uVar9 | ((int)uVar11 >= (int)uVar9) * uVar11;
  uVar17 = ((int)uVar12 < (int)uVar10) * uVar10 | ((int)uVar12 >= (int)uVar10) * uVar12;
  uVar18 = ((int)uVar9 < (int)uVar11) * uVar11 | ((int)uVar9 >= (int)uVar11) * uVar9;
  uVar12 = ((int)uVar10 < (int)uVar12) * uVar12 | ((int)uVar10 >= (int)uVar12) * uVar10;
  uVar11 = ((int)uVar17 < (int)uVar13) * uVar13 | ((int)uVar17 >= (int)uVar13) * uVar17;
  uVar9 = ((int)uVar18 < (int)uVar17) * uVar17 | ((int)uVar18 >= (int)uVar17) * uVar18;
  uVar10 = ((int)uVar12 < (int)uVar18) * uVar18 | ((int)uVar12 >= (int)uVar18) * uVar12;
  uVar12 = ((int)uVar13 < (int)uVar12) * uVar12 | ((int)uVar13 >= (int)uVar12) * uVar13;
  auVar26._0_4_ = -(uint)(local_18 == uVar11);
  auVar26._4_4_ = -(uint)(uStack_14 == uVar9);
  auVar26._8_4_ = -(uint)(uStack_10 == uVar10);
  auVar26._12_4_ = -(uint)(uStack_c == uVar12);
  auVar23._0_4_ = -(uint)(uVar11 == local_28[0]);
  auVar23._4_4_ = -(uint)(uVar9 == local_28[1]);
  auVar23._8_4_ = -(uint)(uVar10 == local_28[2]);
  auVar23._12_4_ = -(uint)(uVar12 == local_28[3]);
  auVar14 = packssdw(auVar23,auVar26);
  auVar14 = packsswb(auVar14,auVar14);
  uVar1 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar14[0xf] >> 7) << 0xf;
  uVar10 = uVar1 - 1 ^ (uint)uVar1;
  uVar9 = 0x1f;
  if (uVar10 != 0) {
    for (; uVar10 >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  *var = (int)(uVar11 - local_28[uVar9 & 7 ^ 4]) >> 10;
  return uVar9;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}